

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.cpp
# Opt level: O0

bool __thiscall
CScript::IsWitnessProgram
          (CScript *this,int *version,vector<unsigned_char,_std::allocator<unsigned_char>_> *program
          )

{
  byte bVar1;
  long lVar2;
  size_type sVar3;
  int iVar4;
  uchar *puVar5;
  byte *pbVar6;
  const_iterator __last;
  const_iterator in_RDX;
  int *in_RSI;
  allocator_type *in_RDI;
  long in_FS_OFFSET;
  opcodetype in_stack_ffffffffffffff68;
  size_type in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  size_type in_stack_ffffffffffffff74;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff98;
  undefined1 local_2a;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  sVar3 = prevector<28U,_unsigned_char,_unsigned_int,_int>::size
                    ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                     CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
  if (3 < sVar3) {
    sVar3 = prevector<28U,_unsigned_char,_unsigned_int,_int>::size
                      ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                       CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
    if (sVar3 < 0x2b) {
      puVar5 = prevector<28U,_unsigned_char,_unsigned_int,_int>::operator[]
                         ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                          CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),
                          in_stack_ffffffffffffff74);
      if (*puVar5 == '\0') {
LAB_003fc08e:
        pbVar6 = prevector<28U,_unsigned_char,_unsigned_int,_int>::operator[]
                           ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                            CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),
                            in_stack_ffffffffffffff74);
        bVar1 = *pbVar6;
        sVar3 = prevector<28U,_unsigned_char,_unsigned_int,_int>::size
                          ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                           CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
        if (bVar1 + 2 == sVar3) {
          prevector<28U,_unsigned_char,_unsigned_int,_int>::operator[]
                    ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                     CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),
                     in_stack_ffffffffffffff74);
          iVar4 = DecodeOP_N(in_stack_ffffffffffffff68);
          *in_RSI = iVar4;
          prevector<28U,_unsigned_char,_unsigned_int,_int>::begin
                    ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                     CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
          __last = prevector<28U,_unsigned_char,_unsigned_int,_int>::const_iterator::operator+
                             ((const_iterator *)
                              CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                              in_stack_ffffffffffffff6c);
          prevector<28U,_unsigned_char,_unsigned_int,_int>::end
                    ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                     CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
          std::allocator<unsigned_char>::allocator
                    ((allocator<unsigned_char> *)
                     CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          vector<prevector<28u,unsigned_char,unsigned_int,int>::const_iterator,void>
                    (in_stack_ffffffffffffff98,in_RDX,__last,in_RDI);
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78));
          std::allocator<unsigned_char>::~allocator
                    ((allocator<unsigned_char> *)
                     CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
          local_2a = true;
        }
        else {
          local_2a = false;
        }
      }
      else {
        pbVar6 = prevector<28U,_unsigned_char,_unsigned_int,_int>::operator[]
                           ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                            CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),
                            in_stack_ffffffffffffff74);
        if (0x50 < *pbVar6) {
          pbVar6 = prevector<28U,_unsigned_char,_unsigned_int,_int>::operator[]
                             ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                              CONCAT17(in_stack_ffffffffffffff7f,in_stack_ffffffffffffff78),
                              in_stack_ffffffffffffff74);
          if (*pbVar6 < 0x61) goto LAB_003fc08e;
        }
        local_2a = false;
      }
      goto LAB_003fc18c;
    }
  }
  local_2a = false;
LAB_003fc18c:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return local_2a;
  }
  __stack_chk_fail();
}

Assistant:

bool CScript::IsWitnessProgram(int& version, std::vector<unsigned char>& program) const
{
    if (this->size() < 4 || this->size() > 42) {
        return false;
    }
    if ((*this)[0] != OP_0 && ((*this)[0] < OP_1 || (*this)[0] > OP_16)) {
        return false;
    }
    if ((size_t)((*this)[1] + 2) == this->size()) {
        version = DecodeOP_N((opcodetype)(*this)[0]);
        program = std::vector<unsigned char>(this->begin() + 2, this->end());
        return true;
    }
    return false;
}